

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldAccessorDefinitions
          (MessageGenerator *this,Printer *printer)

{
  size_t *this_00;
  bool bVar1;
  bool bVar2;
  value_type field_00;
  Descriptor *pDVar3;
  OneofDescriptor *pOVar4;
  string *psVar5;
  FieldGenerator *pFVar6;
  int __c;
  AlphaNum *a;
  char *pcVar7;
  Iterator IVar8;
  Formatter local_260;
  Formatter local_228;
  AlphaNum local_1f0;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  string local_150;
  allocator local_129;
  string local_128;
  char *local_108;
  undefined1 local_100 [8];
  SaveState saver;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  value_type field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  Formatter::operator()<>((Formatter *)local_50,"// $classname$\n\n");
  __begin3.descriptor = (Descriptor *)FieldRange<google::protobuf::Descriptor>(this->descriptor_);
  IVar8 = FieldRangeImpl<google::protobuf::Descriptor>::begin
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __begin3._0_8_ = IVar8.descriptor;
  __end3.descriptor._0_4_ = IVar8.idx;
  IVar8 = FieldRangeImpl<google::protobuf::Descriptor>::end
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __end3._0_8_ = IVar8.descriptor;
  field._0_4_ = IVar8.idx;
  while (bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field), bVar1) {
    field_00 = FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                         ((Iterator *)&__end3.descriptor);
    PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_50,field_00);
    bVar1 = IsFieldStripped(field_00,&this->options_);
    if (!bVar1) {
      this_00 = &saver.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this_00);
      SetCommonFieldVariables
                (field_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this_00,&this->options_);
      Formatter::SaveState::SaveState((SaveState *)local_100,(Formatter *)local_50);
      Formatter::AddMap((Formatter *)local_50,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&saver.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = FieldDescriptor::is_repeated(field_00);
      if (bVar1) {
        bVar1 = IsFieldStripped(field_00,&this->options_);
        if (bVar1) {
          Formatter::operator()<>
                    ((Formatter *)local_50,
                     "inline int $classname$::$name$_size() const { __builtin_trap(); }\n");
        }
        else {
          bVar2 = IsImplicitWeakField(field_00,&this->options_,this->scc_analyzer_);
          bVar1 = false;
          if (bVar2) {
            pDVar3 = FieldDescriptor::message_type(field_00);
            bVar1 = pDVar3 != (Descriptor *)0x0;
          }
          local_108 = "";
          if (bVar1) {
            local_108 = ".weak";
          }
          Formatter::operator()
                    ((Formatter *)local_50,
                     "inline int $classname$::_internal_$name$_size() const {\n  return $name$_$1$.size();\n}\ninline int $classname$::$name$_size() const {\n$annotate_size$  return _internal_$name$_size();\n}\n"
                     ,&local_108);
        }
      }
      else {
        pOVar4 = FieldDescriptor::real_containing_oneof(field_00);
        if (pOVar4 == (OneofDescriptor *)0x0) {
          Formatter::Formatter(&local_228,(Formatter *)local_50);
          GenerateSingularFieldHasBits(this,field_00,&local_228);
          Formatter::~Formatter(&local_228);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_128,"field_name",&local_129);
          psVar5 = FieldDescriptor::name_abi_cxx11_(field_00);
          UnderscoresToCamelCase(&local_150,psVar5,true);
          Formatter::Set<std::__cxx11::string>((Formatter *)local_50,&local_128,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_170,"oneof_name",&local_171);
          pOVar4 = FieldDescriptor::containing_oneof(field_00);
          psVar5 = OneofDescriptor::name_abi_cxx11_(pOVar4);
          Formatter::Set<std::__cxx11::string>((Formatter *)local_50,&local_170,psVar5);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
          std::allocator<char>::allocator();
          pcVar7 = "oneof_index";
          std::__cxx11::string::string((string *)&local_198,"oneof_index",&local_199);
          pOVar4 = FieldDescriptor::containing_oneof(field_00);
          pcVar7 = OneofDescriptor::index(pOVar4,pcVar7,__c);
          strings::AlphaNum::AlphaNum(&local_1f0,(int)pcVar7);
          StrCat_abi_cxx11_(&local_1c0,(protobuf *)&local_1f0,a);
          Formatter::Set<std::__cxx11::string>((Formatter *)local_50,&local_198,&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
          GenerateOneofMemberHasBits(this,field_00,(Formatter *)local_50);
        }
      }
      bVar1 = anon_unknown_0::IsCrossFileMaybeMap(field_00);
      if (!bVar1) {
        Formatter::Formatter(&local_260,(Formatter *)local_50);
        GenerateFieldClear(this,field_00,true,&local_260);
        Formatter::~Formatter(&local_260);
      }
      bVar1 = IsFieldStripped(field_00,&this->options_);
      if (!bVar1) {
        pFVar6 = FieldGeneratorMap::get(&this->field_generators_,field_00);
        (*pFVar6->_vptr_FieldGenerator[6])
                  (pFVar6,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      Formatter::operator()<>((Formatter *)local_50,"\n");
      Formatter::SaveState::~SaveState((SaveState *)local_100);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&saver.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
              ((Iterator *)&__end3.descriptor);
  }
  GenerateOneofHasBits
            (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MessageGenerator::GenerateFieldAccessorDefinitions(io::Printer* printer) {
  Formatter format(printer, variables_);
  format("// $classname$\n\n");

  for (auto field : FieldRange(descriptor_)) {
    PrintFieldComment(format, field);

    if (IsFieldStripped(field, options_)) {
      continue;
    }

    std::map<std::string, std::string> vars;
    SetCommonFieldVariables(field, &vars, options_);

    Formatter::SaveState saver(&format);
    format.AddMap(vars);

    // Generate has_$name$() or $name$_size().
    if (field->is_repeated()) {
      if (IsFieldStripped(field, options_)) {
        format(
            "inline int $classname$::$name$_size() const { "
            "__builtin_trap(); }\n");
      } else {
        format(
            "inline int $classname$::_internal_$name$_size() const {\n"
            "  return $name$_$1$.size();\n"
            "}\n"
            "inline int $classname$::$name$_size() const {\n"
            "$annotate_size$"
            "  return _internal_$name$_size();\n"
            "}\n",
            IsImplicitWeakField(field, options_, scc_analyzer_) &&
                    field->message_type()
                ? ".weak"
                : "");
      }
    } else if (field->real_containing_oneof()) {
      format.Set("field_name", UnderscoresToCamelCase(field->name(), true));
      format.Set("oneof_name", field->containing_oneof()->name());
      format.Set("oneof_index",
                 StrCat(field->containing_oneof()->index()));
      GenerateOneofMemberHasBits(field, format);
    } else {
      // Singular field.
      GenerateSingularFieldHasBits(field, format);
    }

    if (!IsCrossFileMaybeMap(field)) {
      GenerateFieldClear(field, true, format);
    }

    // Generate type-specific accessors.
    if (!IsFieldStripped(field, options_)) {
      field_generators_.get(field).GenerateInlineAccessorDefinitions(printer);
    }

    format("\n");
  }

  // Generate has_$name$() and clear_has_$name$() functions for oneofs.
  GenerateOneofHasBits(printer);
}